

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitGetOptionalObjectMethod
               (RegSlot methodReg,RegSlot objectReg,PropertyId propertyId,
               ByteCodeLabel noMethodLabel,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId;
  
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,true,false);
  Js::ByteCodeWriter::PatchableProperty
            (&byteCodeGenerator->m_writer,LdFld,methodReg,objectReg,cacheId,false,true);
  Js::ByteCodeWriter::BrReg2
            (&byteCodeGenerator->m_writer,BrEq_A,noMethodLabel,methodReg,
             funcInfo->undefinedConstantRegister);
  return;
}

Assistant:

void EmitGetOptionalObjectMethod(
    Js::RegSlot methodReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    Js::ByteCodeLabel noMethodLabel,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ true,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdFld,
        methodReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ true);

    byteCodeGenerator->Writer()->BrReg2(
        Js::OpCode::BrEq_A,
        noMethodLabel,
        methodReg,
        funcInfo->undefinedConstantRegister);
}